

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O1

void __thiscall
duckdb::LeftDelimJoinGlobalState::LeftDelimJoinGlobalState
          (LeftDelimJoinGlobalState *this,ClientContext *context,PhysicalLeftDelimJoin *delim_join)

{
  PhysicalOperator *pPVar1;
  const_reference pvVar2;
  reference pvVar3;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> vStack_38;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__LeftDelimJoinGlobalState_024a5a10;
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(delim_join->super_PhysicalDelimJoin).super_PhysicalOperator.children,0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&vStack_38,
             &(pvVar2->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ColumnDataCollection::ColumnDataCollection
            (&this->lhs_data,context,(vector<duckdb::LogicalType,_true> *)&vStack_38,
             BUFFER_MANAGER_ALLOCATOR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&vStack_38);
  *(undefined8 *)((long)&(this->lhs_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lhs_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->lhs_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lhs_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->lhs_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&((delim_join->super_PhysicalDelimJoin).join)->children,0);
  pPVar1 = pvVar3->_M_data;
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)(pPVar1 + 1),(pointer)0x0);
  *(ColumnDataCollection **)&pPVar1[1].type = &this->lhs_data;
  return;
}

Assistant:

explicit LeftDelimJoinGlobalState(ClientContext &context, const PhysicalLeftDelimJoin &delim_join)
	    : lhs_data(context, delim_join.children[0].get().GetTypes()) {
		D_ASSERT(!delim_join.delim_scans.empty());
		// set up the delim join chunk to scan in the original join
		auto &cast_cached_scan = delim_join.join.children[0].get().Cast<PhysicalColumnDataScan>();
		cast_cached_scan.collection = &lhs_data;
	}